

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_rc2.cc
# Opt level: O2

void RC2_decrypt(ulong *data,RC2_KEY *key)

{
  ushort *puVar1;
  ushort *puVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  ushort uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  
  uVar9 = (uint)*data;
  uVar8 = *(uint *)((long)data + 4);
  uVar3 = uVar9 >> 0x10;
  uVar6 = uVar8 >> 0x10;
  puVar2 = (ushort *)((long)key->data + 0x7e);
  iVar7 = 5;
  iVar5 = 3;
  while( true ) {
    do {
      uVar4 = uVar9 & 0xffff;
      uVar12 = uVar8 & 0xffff;
      uVar11 = (uVar6 >> 5 | uVar6 << 0xb) - ((uint)*puVar2 + (uVar8 & uVar3) + (~uVar12 & uVar9));
      uVar6 = uVar11 & 0xffff;
      uVar13 = (uVar12 >> 3 | uVar12 << 0xd) -
               ((uint)puVar2[-1] + (uVar3 & uVar9) + (~uVar3 & uVar11));
      uVar8 = uVar13 & 0xffff;
      uVar12 = (uVar3 >> 2 | uVar3 << 0xe) -
               ((uint)puVar2[-2] + (uVar9 & uVar11) + (~uVar4 & uVar13));
      uVar3 = uVar12 & 0xffff;
      puVar1 = puVar2 + -3;
      puVar2 = puVar2 + -4;
      uVar9 = (uVar4 >> 1 | uVar4 << 0xf) - ((uint)*puVar1 + (uVar13 & uVar11) + (~uVar6 & uVar12));
      iVar7 = iVar7 + -1;
    } while (iVar7 != 0);
    iVar5 = iVar5 + -1;
    if (iVar5 == 0) break;
    iVar7 = (iVar5 == 2) + 5;
    uVar10 = (short)uVar11 - *(short *)((long)key->data + (ulong)(uVar13 & 0x3f) * 2);
    uVar6 = (uint)uVar10;
    uVar8 = uVar8 - *(ushort *)((long)key->data + (ulong)(uVar12 & 0x3f) * 2);
    uVar3 = uVar9 & 0x3f;
    uVar9 = uVar9 - *(ushort *)((long)key->data + (ulong)(uVar10 & 0x3f) * 2);
    uVar3 = (uint)(ushort)((short)uVar12 - *(short *)((long)key->data + (ulong)uVar3 * 2));
  }
  *(uint *)data = uVar3 << 0x10 | uVar9 & 0xffff;
  *(uint *)((long)data + 4) = uVar8 | uVar6 << 0x10;
  return;
}

Assistant:

static void RC2_decrypt(uint32_t *d, RC2_KEY *key) {
  int i, n;
  uint16_t *p0, *p1;
  uint16_t x0, x1, x2, x3, t;
  uint32_t l;

  l = d[0];
  x0 = (uint16_t)l & 0xffff;
  x1 = (uint16_t)(l >> 16L);
  l = d[1];
  x2 = (uint16_t)l & 0xffff;
  x3 = (uint16_t)(l >> 16L);

  n = 3;
  i = 5;

  p0 = &key->data[63];
  p1 = &key->data[0];
  for (;;) {
    t = ((x3 << 11) | (x3 >> 5)) & 0xffff;
    x3 = (t - (x0 & ~x2) - (x1 & x2) - *(p0--)) & 0xffff;
    t = ((x2 << 13) | (x2 >> 3)) & 0xffff;
    x2 = (t - (x3 & ~x1) - (x0 & x1) - *(p0--)) & 0xffff;
    t = ((x1 << 14) | (x1 >> 2)) & 0xffff;
    x1 = (t - (x2 & ~x0) - (x3 & x0) - *(p0--)) & 0xffff;
    t = ((x0 << 15) | (x0 >> 1)) & 0xffff;
    x0 = (t - (x1 & ~x3) - (x2 & x3) - *(p0--)) & 0xffff;

    if (--i == 0) {
      if (--n == 0) {
        break;
      }
      i = (n == 2) ? 6 : 5;

      x3 = (x3 - p1[x2 & 0x3f]) & 0xffff;
      x2 = (x2 - p1[x1 & 0x3f]) & 0xffff;
      x1 = (x1 - p1[x0 & 0x3f]) & 0xffff;
      x0 = (x0 - p1[x3 & 0x3f]) & 0xffff;
    }
  }

  d[0] = (uint32_t)(x0 & 0xffff) | ((uint32_t)(x1 & 0xffff) << 16L);
  d[1] = (uint32_t)(x2 & 0xffff) | ((uint32_t)(x3 & 0xffff) << 16L);
}